

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls12_client.c
# Opt level: O0

int ssl_check_server_ecdh_params(mbedtls_ssl_context *ssl)

{
  mbedtls_ecp_group_id grp_id_00;
  uint16_t tls_id_00;
  int iVar1;
  char *pcVar2;
  mbedtls_ecp_group_id grp_id;
  uint16_t tls_id;
  mbedtls_ssl_context *ssl_local;
  
  grp_id_00 = (ssl->handshake->ecdh_ctx).grp_id;
  tls_id_00 = mbedtls_ssl_get_tls_id_from_ecp_group_id(grp_id_00);
  if (tls_id_00 == 0) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
               ,0x70a,"should never happen");
    ssl_local._4_4_ = -0x6c00;
  }
  else {
    pcVar2 = mbedtls_ssl_get_curve_name_from_tls_id(tls_id_00);
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
               ,0x70f,"ECDH curve: %s",pcVar2);
    iVar1 = mbedtls_ssl_check_curve(ssl,grp_id_00);
    if (iVar1 == 0) {
      mbedtls_debug_printf_ecdh
                (ssl,3,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                 ,0x716,&ssl->handshake->ecdh_ctx,MBEDTLS_DEBUG_ECDH_QP);
      ssl_local._4_4_ = 0;
    }
    else {
      ssl_local._4_4_ = -1;
    }
  }
  return ssl_local._4_4_;
}

Assistant:

MBEDTLS_CHECK_RETURN_CRITICAL
static int ssl_check_server_ecdh_params(const mbedtls_ssl_context *ssl)
{
    uint16_t tls_id;
    mbedtls_ecp_group_id grp_id;
#if defined(MBEDTLS_ECDH_LEGACY_CONTEXT)
    grp_id = ssl->handshake->ecdh_ctx.grp.id;
#else
    grp_id = ssl->handshake->ecdh_ctx.grp_id;
#endif

    tls_id = mbedtls_ssl_get_tls_id_from_ecp_group_id(grp_id);
    if (tls_id == 0) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("should never happen"));
        return MBEDTLS_ERR_SSL_INTERNAL_ERROR;
    }

    MBEDTLS_SSL_DEBUG_MSG(2, ("ECDH curve: %s",
                              mbedtls_ssl_get_curve_name_from_tls_id(tls_id)));

    if (mbedtls_ssl_check_curve(ssl, grp_id) != 0) {
        return -1;
    }

    MBEDTLS_SSL_DEBUG_ECDH(3, &ssl->handshake->ecdh_ctx,
                           MBEDTLS_DEBUG_ECDH_QP);

    return 0;
}